

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int wally_aes(uchar *key,size_t key_len,uchar *bytes,size_t bytes_len,uint32_t flags,
             uchar *bytes_out,size_t len)

{
  int iVar1;
  AES256_ctx AStack_f8;
  
  iVar1 = -2;
  if ((((key != (uchar *)0x0) && (key_len < 0x21)) && ((0x101010000U >> (key_len & 0x3f) & 1) != 0))
     && (((~flags & 3) != 0 && bytes != (uchar *)0x0 && (bytes_len != 0)))) {
    iVar1 = -2;
    if (((((uint)len | (uint)bytes_len) & 0xf) == 0) &&
       ((bytes_out != (uchar *)0x0 && flags < 4) && len != 0)) {
      if ((flags & 1) == 0) {
        aes_dec(&AStack_f8,key,key_len,bytes,bytes_len,bytes_out);
      }
      else {
        aes_enc(&AStack_f8,key,key_len,bytes,bytes_len,bytes_out);
      }
      wally_clear(&AStack_f8,0xf0);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_aes(const unsigned char *key, size_t key_len,
              const unsigned char *bytes, size_t bytes_len,
              uint32_t flags,
              unsigned char *bytes_out, size_t len)
{
    AES256_ctx ctx;

    if (!are_valid_args(key, key_len, bytes, bytes_len, flags) ||
        len % AES_BLOCK_LEN || !bytes_len || bytes_len % AES_BLOCK_LEN ||
        flags & ~ALL_OPS || !bytes_out || !len)
        return WALLY_EINVAL;

    if (flags & AES_FLAG_ENCRYPT)
        aes_enc(&ctx, key, key_len, bytes, bytes_len, bytes_out);
    else
        aes_dec(&ctx, key, key_len, bytes, bytes_len, bytes_out);

    wally_clear(&ctx, sizeof(ctx));
    return WALLY_OK;
}